

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O2

void * mspace_malloc(mspace msp,size_t bytes)

{
  long *plVar1;
  byte *pbVar2;
  undefined8 *puVar3;
  malloc_chunk *pmVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  ulong uVar9;
  undefined8 *puVar10;
  void *pvVar11;
  undefined8 *puVar12;
  mchunkptr pmVar13;
  long *plVar14;
  msegmentptr pmVar15;
  int *piVar16;
  undefined8 *puVar17;
  ulong uVar18;
  undefined8 *puVar19;
  size_t dvs;
  uint uVar20;
  malloc_chunk *pmVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  ulong *puVar26;
  mchunkptr pmVar27;
  long lVar28;
  byte bVar29;
  malloc_chunk *pmVar30;
  mchunkptr pmVar31;
  undefined8 *puVar32;
  size_t sVar33;
  malloc_chunk *pmVar34;
  malloc_chunk *pmVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  
  if (bytes < 0xe9) {
    uVar25 = 0x20;
    if (0x16 < bytes) {
      uVar25 = (ulong)((int)bytes + 0x17U & 0x1f0);
    }
    uVar20 = *msp;
    bVar29 = (byte)(uVar25 >> 3);
    uVar23 = uVar20 >> (bVar29 & 0x1f);
    if ((uVar23 & 3) != 0) {
      uVar24 = (uVar23 & 1 | (uint)(uVar25 >> 3)) ^ 1;
      uVar23 = uVar24 << 4;
      uVar8 = (long)msp + (ulong)uVar23 + 0x48;
      lVar28 = *(long *)((long)msp + (ulong)uVar23 + 0x58);
      uVar25 = *(ulong *)(lVar28 + 0x10);
      if (uVar8 == uVar25) {
        *(uint *)msp = uVar20 & ~(1 << (uVar24 & 0x1f));
      }
      else {
        if ((uVar25 < *(ulong *)((long)msp + 0x18)) || (*(long *)(uVar25 + 0x18) != lVar28))
        goto LAB_00102d78;
        *(ulong *)(uVar25 + 0x18) = uVar8;
        *(ulong *)((long)msp + (ulong)uVar23 + 0x58) = uVar25;
      }
      *(ulong *)(lVar28 + 8) = (ulong)(uVar24 << 3) + 3;
      pbVar2 = (byte *)(lVar28 + 8 + (ulong)(uVar24 << 3));
      *pbVar2 = *pbVar2 | 1;
      return (void *)(lVar28 + 0x10);
    }
    uVar8 = *(ulong *)((long)msp + 8);
    if (uVar8 < uVar25) {
      if (uVar23 != 0) {
        uVar24 = 2 << (bVar29 & 0x1f);
        uVar24 = (-uVar24 | uVar24) & uVar23 << (bVar29 & 0x1f);
        uVar23 = 0;
        if (uVar24 != 0) {
          for (; (uVar24 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
          }
        }
        uVar24 = uVar23 << 4;
        uVar9 = (long)msp + (ulong)uVar24 + 0x48;
        lVar28 = *(long *)((long)msp + (ulong)uVar24 + 0x58);
        uVar18 = *(ulong *)(lVar28 + 0x10);
        if (uVar9 == uVar18) {
          uVar20 = uVar20 & ~(1 << (uVar23 & 0x1f));
          *(uint *)msp = uVar20;
        }
        else {
          if ((uVar18 < *(ulong *)((long)msp + 0x18)) || (*(long *)(uVar18 + 0x18) != lVar28))
          goto LAB_00102d78;
          *(ulong *)(uVar18 + 0x18) = uVar9;
          *(ulong *)((long)msp + (ulong)uVar24 + 0x58) = uVar18;
        }
        uVar18 = (ulong)(uVar23 << 3);
        uVar9 = uVar18 - uVar25;
        if (uVar9 < 0x20) {
          *(ulong *)(lVar28 + 8) = uVar18 | 3;
          pbVar2 = (byte *)(lVar28 + 8 + uVar18);
          *pbVar2 = *pbVar2 | 1;
          return (void *)(lVar28 + 0x10);
        }
        *(ulong *)(lVar28 + 8) = uVar25 | 3;
        *(ulong *)(lVar28 + 8 + uVar25) = uVar9 | 1;
        *(ulong *)(lVar28 + uVar18) = uVar9;
        if (uVar8 != 0) {
          lVar22 = *(long *)((long)msp + 0x20);
          uVar23 = (uint)(uVar8 >> 3);
          uVar18 = (long)msp + (ulong)(uVar23 * 2) * 8 + 0x48;
          if ((uVar20 >> (uVar23 & 0x1f) & 1) == 0) {
            *(uint *)msp = uVar20 | 1 << ((byte)(uVar8 >> 3) & 0x1f);
            uVar8 = uVar18;
          }
          else {
            uVar8 = *(ulong *)(uVar18 + 0x10);
            if (*(ulong *)(uVar18 + 0x10) < *(ulong *)((long)msp + 0x18)) goto LAB_00102d78;
          }
          *(long *)(uVar18 + 0x10) = lVar22;
          *(long *)(uVar8 + 0x18) = lVar22;
          *(ulong *)(lVar22 + 0x10) = uVar8;
          *(ulong *)(lVar22 + 0x18) = uVar18;
        }
        *(ulong *)((long)msp + 8) = uVar9;
        *(ulong *)((long)msp + 0x20) = lVar28 + uVar25;
        return (void *)(lVar28 + 0x10);
      }
      uVar23 = *(uint *)((long)msp + 4);
      if (uVar23 != 0) {
        uVar24 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
          }
        }
        puVar12 = *(undefined8 **)((long)msp + (ulong)uVar24 * 8 + 600);
        uVar18 = (puVar12[1] & 0xfffffffffffffff8) - uVar25;
        puVar19 = puVar12;
        while ((puVar17 = (undefined8 *)puVar19[4], puVar17 != (undefined8 *)0x0 ||
               (puVar17 = (undefined8 *)puVar19[5], puVar17 != (undefined8 *)0x0))) {
          uVar9 = (puVar17[1] & 0xfffffffffffffff8) - uVar25;
          puVar19 = puVar17;
          if (uVar9 < uVar18) {
            puVar12 = puVar17;
            uVar18 = uVar9;
          }
        }
        puVar19 = *(undefined8 **)((long)msp + 0x18);
        if (puVar12 < puVar19) goto LAB_00102d78;
        puVar17 = (undefined8 *)puVar12[3];
        uVar9 = puVar12[6];
        if (puVar17 == puVar12) {
          if ((undefined8 *)puVar12[5] == (undefined8 *)0x0) {
            if ((undefined8 *)puVar12[4] == (undefined8 *)0x0) {
              puVar17 = (undefined8 *)0x0;
              goto LAB_00101efa;
            }
            puVar10 = (undefined8 *)puVar12[4];
            puVar3 = puVar12 + 4;
          }
          else {
            puVar10 = (undefined8 *)puVar12[5];
            puVar3 = puVar12 + 5;
          }
          do {
            do {
              puVar32 = puVar3;
              puVar17 = puVar10;
              puVar10 = (undefined8 *)puVar17[5];
              puVar3 = puVar17 + 5;
            } while ((undefined8 *)puVar17[5] != (undefined8 *)0x0);
            puVar10 = (undefined8 *)puVar17[4];
            puVar3 = puVar17 + 4;
          } while ((undefined8 *)puVar17[4] != (undefined8 *)0x0);
          if (puVar32 < puVar19) goto LAB_00102d78;
          *puVar32 = 0;
        }
        else {
          puVar10 = (undefined8 *)puVar12[2];
          if (((puVar10 < puVar19) || ((undefined8 *)puVar10[3] != puVar12)) ||
             ((undefined8 *)puVar17[2] != puVar12)) goto LAB_00102d78;
          puVar10[3] = puVar17;
          puVar17[2] = puVar10;
        }
LAB_00101efa:
        if (uVar9 != 0) {
          uVar24 = *(uint *)(puVar12 + 7);
          if (puVar12 == *(undefined8 **)((long)msp + (ulong)uVar24 * 8 + 600)) {
            *(undefined8 **)((long)msp + (ulong)uVar24 * 8 + 600) = puVar17;
            if (puVar17 == (undefined8 *)0x0) {
              *(uint *)((long)msp + 4) = uVar23 & ~(1 << (uVar24 & 0x1f));
            }
            else {
LAB_00101f3d:
              puVar19 = *(undefined8 **)((long)msp + 0x18);
              if (puVar17 < puVar19) goto LAB_00102d78;
              puVar17[6] = uVar9;
              puVar10 = (undefined8 *)puVar12[4];
              if (puVar10 != (undefined8 *)0x0) {
                if (puVar10 < puVar19) goto LAB_00102d78;
                puVar17[4] = puVar10;
                puVar10[6] = puVar17;
              }
              uVar9 = puVar12[5];
              if (uVar9 != 0) {
                if (uVar9 < *(ulong *)((long)msp + 0x18)) goto LAB_00102d78;
                puVar17[5] = uVar9;
                *(undefined8 **)(uVar9 + 0x30) = puVar17;
              }
            }
          }
          else {
            if (uVar9 < *(ulong *)((long)msp + 0x18)) goto LAB_00102d78;
            *(undefined8 **)(uVar9 + 0x20 + (ulong)(*(undefined8 **)(uVar9 + 0x20) != puVar12) * 8)
                 = puVar17;
            if (puVar17 != (undefined8 *)0x0) goto LAB_00101f3d;
          }
        }
        if (uVar18 < 0x20) {
          puVar12[1] = uVar18 + uVar25 | 3;
          pbVar2 = (byte *)((long)puVar12 + uVar18 + uVar25 + 8);
          *pbVar2 = *pbVar2 | 1;
        }
        else {
          puVar12[1] = uVar25 | 3;
          *(ulong *)((long)puVar12 + uVar25 + 8) = uVar18 | 1;
          *(ulong *)((long)puVar12 + uVar25 + uVar18) = uVar18;
          if (uVar8 != 0) {
            lVar28 = *(long *)((long)msp + 0x20);
            uVar23 = (uint)(uVar8 >> 3);
            uVar9 = (long)msp + (ulong)(uVar23 * 2) * 8 + 0x48;
            if ((uVar20 >> (uVar23 & 0x1f) & 1) == 0) {
              *(uint *)msp = 1 << ((byte)(uVar8 >> 3) & 0x1f) | uVar20;
              uVar8 = uVar9;
            }
            else {
              uVar8 = *(ulong *)((long)msp + (ulong)(uVar23 * 2) * 8 + 0x58);
              if (uVar8 < *(ulong *)((long)msp + 0x18)) goto LAB_00102d78;
            }
            *(long *)((long)msp + (ulong)(uVar23 * 2) * 8 + 0x58) = lVar28;
            *(long *)(uVar8 + 0x18) = lVar28;
            *(ulong *)(lVar28 + 0x10) = uVar8;
            *(ulong *)(lVar28 + 0x18) = uVar9;
          }
          *(ulong *)((long)msp + 8) = uVar18;
          *(ulong *)((long)msp + 0x20) = (long)puVar12 + uVar25;
        }
        goto LAB_00102133;
      }
    }
  }
  else if (bytes < 0xffffffffffffff80) {
    uVar25 = bytes + 0x17 & 0xfffffffffffffff0;
    uVar20 = *(uint *)((long)msp + 4);
    if (uVar20 != 0) {
      uVar23 = (uint)(bytes + 0x17 >> 8);
      if (uVar23 == 0) {
        uVar8 = 0;
      }
      else if (uVar23 < 0x10000) {
        uVar24 = 0x1f;
        if (uVar23 != 0) {
          for (; uVar23 >> uVar24 == 0; uVar24 = uVar24 - 1) {
          }
        }
        uVar8 = (ulong)((uint)((uVar25 >> ((ulong)(byte)(0x26 - (char)(uVar24 ^ 0x1f)) & 0x3f) & 1)
                              != 0) + (uVar24 ^ 0x1f) * 2 ^ 0x3e);
      }
      else {
        uVar8 = 0x1f;
      }
      uVar18 = -uVar25;
      puVar19 = *(undefined8 **)((long)msp + uVar8 * 8 + 600);
      if (puVar19 == (undefined8 *)0x0) {
        puVar17 = (undefined8 *)0x0;
        puVar12 = (undefined8 *)0x0;
      }
      else {
        bVar29 = 0x39 - (char)(uVar8 >> 1);
        if ((int)uVar8 == 0x1f) {
          bVar29 = 0;
        }
        lVar28 = uVar25 << (bVar29 & 0x3f);
        puVar17 = (undefined8 *)0x0;
        puVar10 = (undefined8 *)0x0;
        do {
          puVar12 = puVar19;
          uVar9 = (puVar12[1] & 0xfffffffffffffff8) - uVar25;
          if ((uVar9 < uVar18) && (puVar10 = puVar12, uVar18 = uVar9, uVar9 == 0)) {
            uVar18 = 0;
            puVar17 = puVar12;
            goto LAB_00102a64;
          }
          puVar3 = (undefined8 *)puVar12[5];
          puVar19 = (undefined8 *)puVar12[4 - (lVar28 >> 0x3f)];
          puVar12 = puVar3;
          if (puVar3 == puVar19) {
            puVar12 = puVar17;
          }
          if (puVar3 != (undefined8 *)0x0) {
            puVar17 = puVar12;
          }
          lVar28 = lVar28 * 2;
          puVar12 = puVar10;
        } while (puVar19 != (undefined8 *)0x0);
      }
      if (puVar17 != (undefined8 *)0x0 || puVar12 != (undefined8 *)0x0) goto LAB_00102a64;
      uVar23 = 2 << ((byte)uVar8 & 0x1f);
      uVar23 = (-uVar23 | uVar23) & uVar20;
      if (uVar23 == 0) {
        puVar12 = (undefined8 *)0x0;
        puVar17 = (undefined8 *)0x0;
        goto LAB_00102a64;
      }
      uVar24 = 0;
      if (uVar23 != 0) {
        for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
        }
      }
      puVar19 = (undefined8 *)((long)msp + (ulong)uVar24 * 8 + 600);
      puVar12 = (undefined8 *)0x0;
LAB_00102a61:
      puVar17 = (undefined8 *)*puVar19;
LAB_00102a64:
      while (puVar19 = puVar17, puVar19 != (undefined8 *)0x0) {
        uVar8 = (puVar19[1] & 0xfffffffffffffff8) - uVar25;
        bVar36 = uVar8 < uVar18;
        if (bVar36) {
          uVar18 = uVar8;
        }
        if (bVar36) {
          puVar12 = puVar19;
        }
        puVar17 = (undefined8 *)puVar19[4];
        if ((undefined8 *)puVar19[4] == (undefined8 *)0x0) goto code_r0x00102a8b;
      }
      if ((puVar12 == (undefined8 *)0x0) || (*(long *)((long)msp + 8) - uVar25 <= uVar18))
      goto LAB_0010202c;
      puVar19 = *(undefined8 **)((long)msp + 0x18);
      if ((puVar12 < puVar19) || ((long)uVar25 < 1)) goto LAB_00102d78;
      puVar17 = (undefined8 *)puVar12[3];
      uVar8 = puVar12[6];
      if (puVar17 != puVar12) {
        puVar10 = (undefined8 *)puVar12[2];
        if (((puVar10 < puVar19) || ((undefined8 *)puVar10[3] != puVar12)) ||
           ((undefined8 *)puVar17[2] != puVar12)) goto LAB_00102d78;
        puVar10[3] = puVar17;
        puVar17[2] = puVar10;
        goto LAB_00102b45;
      }
      if ((undefined8 *)puVar12[5] != (undefined8 *)0x0) {
        puVar10 = (undefined8 *)puVar12[5];
        puVar3 = puVar12 + 5;
        goto LAB_00102b18;
      }
      if ((undefined8 *)puVar12[4] == (undefined8 *)0x0) {
        puVar17 = (undefined8 *)0x0;
        goto LAB_00102b45;
      }
      puVar10 = (undefined8 *)puVar12[4];
      puVar3 = puVar12 + 4;
LAB_00102b18:
      do {
        do {
          puVar32 = puVar3;
          puVar17 = puVar10;
          puVar10 = (undefined8 *)puVar17[5];
          puVar3 = puVar17 + 5;
        } while ((undefined8 *)puVar17[5] != (undefined8 *)0x0);
        puVar10 = (undefined8 *)puVar17[4];
        puVar3 = puVar17 + 4;
      } while ((undefined8 *)puVar17[4] != (undefined8 *)0x0);
      if (puVar32 < puVar19) goto LAB_00102d78;
      *puVar32 = 0;
LAB_00102b45:
      if (uVar8 != 0) {
        uVar23 = *(uint *)(puVar12 + 7);
        if (puVar12 == *(undefined8 **)((long)msp + (ulong)uVar23 * 8 + 600)) {
          *(undefined8 **)((long)msp + (ulong)uVar23 * 8 + 600) = puVar17;
          if (puVar17 == (undefined8 *)0x0) {
            *(uint *)((long)msp + 4) = uVar20 & ~(1 << (uVar23 & 0x1f));
          }
          else {
LAB_00102b82:
            puVar19 = *(undefined8 **)((long)msp + 0x18);
            if (puVar17 < puVar19) goto LAB_00102d78;
            puVar17[6] = uVar8;
            puVar10 = (undefined8 *)puVar12[4];
            if (puVar10 != (undefined8 *)0x0) {
              if (puVar10 < puVar19) goto LAB_00102d78;
              puVar17[4] = puVar10;
              puVar10[6] = puVar17;
            }
            uVar8 = puVar12[5];
            if (uVar8 != 0) {
              if (uVar8 < *(ulong *)((long)msp + 0x18)) goto LAB_00102d78;
              puVar17[5] = uVar8;
              *(undefined8 **)(uVar8 + 0x30) = puVar17;
            }
          }
        }
        else {
          if (uVar8 < *(ulong *)((long)msp + 0x18)) goto LAB_00102d78;
          *(undefined8 **)(uVar8 + 0x20 + (ulong)(*(undefined8 **)(uVar8 + 0x20) != puVar12) * 8) =
               puVar17;
          if (puVar17 != (undefined8 *)0x0) goto LAB_00102b82;
        }
      }
      if (uVar18 < 0x20) {
        puVar12[1] = uVar18 + uVar25 | 3;
        pbVar2 = (byte *)((long)puVar12 + uVar18 + uVar25 + 8);
        *pbVar2 = *pbVar2 | 1;
      }
      else {
        uVar8 = (long)puVar12 + uVar25;
        puVar12[1] = uVar25 | 3;
        *(ulong *)((long)puVar12 + uVar25 + 8) = uVar18 | 1;
        *(ulong *)(uVar8 + uVar18) = uVar18;
        if (uVar18 < 0x100) {
          uVar18 = uVar18 >> 3;
          uVar25 = (long)msp + uVar18 * 0x10 + 0x48;
          if ((*msp >> ((uint)uVar18 & 0x1f) & 1) == 0) {
            *(uint *)msp = *msp | 1 << ((byte)uVar18 & 0x1f);
            uVar9 = uVar25;
          }
          else {
            uVar9 = *(ulong *)((long)msp + uVar18 * 0x10 + 0x58);
            if (uVar9 < *(ulong *)((long)msp + 0x18)) goto LAB_00102d78;
          }
          *(ulong *)((long)msp + uVar18 * 0x10 + 0x58) = uVar8;
          *(ulong *)(uVar9 + 0x18) = uVar8;
          *(ulong *)(uVar8 + 0x10) = uVar9;
          *(ulong *)(uVar8 + 0x18) = uVar25;
          goto LAB_00102133;
        }
        uVar20 = (uint)(uVar18 >> 8);
        if (uVar20 == 0) {
          uVar20 = 0;
        }
        else if (uVar20 < 0x10000) {
          uVar23 = 0x1f;
          if (uVar20 != 0) {
            for (; uVar20 >> uVar23 == 0; uVar23 = uVar23 - 1) {
            }
          }
          uVar20 = (uint)((uVar18 >> ((ulong)(byte)(0x26 - (char)(uVar23 ^ 0x1f)) & 0x3f) & 1) != 0)
                   + (uVar23 ^ 0x1f) * 2 ^ 0x3e;
        }
        else {
          uVar20 = 0x1f;
        }
        puVar26 = (ulong *)((long)msp + (ulong)uVar20 * 8 + 600);
        *(uint *)(uVar8 + 0x38) = uVar20;
        *(undefined1 (*) [16])(uVar8 + 0x20) = (undefined1  [16])0x0;
        if ((*(uint *)((long)msp + 4) >> (uVar20 & 0x1f) & 1) == 0) {
          *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar20 & 0x1f);
          *puVar26 = uVar8;
          *(ulong **)(uVar8 + 0x30) = puVar26;
        }
        else {
          bVar29 = 0x39 - (char)(uVar20 >> 1);
          if (uVar20 == 0x1f) {
            bVar29 = 0;
          }
          lVar28 = uVar18 << (bVar29 & 0x3f);
          uVar25 = *puVar26;
          do {
            uVar9 = uVar25;
            if ((*(ulong *)(uVar9 + 8) & 0xfffffffffffffff8) == uVar18) {
              if ((*(ulong *)((long)msp + 0x18) <= uVar9) &&
                 (uVar25 = *(ulong *)(uVar9 + 0x10), *(ulong *)((long)msp + 0x18) <= uVar25)) {
                *(ulong *)(uVar25 + 0x18) = uVar8;
                *(ulong *)(uVar9 + 0x10) = uVar8;
                *(ulong *)(uVar8 + 0x10) = uVar25;
                *(ulong *)(uVar8 + 0x18) = uVar9;
                *(undefined8 *)(uVar8 + 0x30) = 0;
                goto LAB_00102133;
              }
              goto LAB_00102d78;
            }
            lVar22 = lVar28 >> 0x3f;
            lVar28 = lVar28 * 2;
            uVar25 = *(ulong *)(uVar9 + 0x20 + lVar22 * -8);
          } while (uVar25 != 0);
          puVar26 = (ulong *)(uVar9 + 0x20 + lVar22 * -8);
          if (puVar26 < *(ulong **)((long)msp + 0x18)) goto LAB_00102d78;
          *puVar26 = uVar8;
          *(ulong *)(uVar8 + 0x30) = uVar9;
        }
        *(ulong *)(uVar8 + 0x18) = uVar8;
        *(ulong *)(uVar8 + 0x10) = uVar8;
      }
      goto LAB_00102133;
    }
  }
  else {
    uVar25 = 0xffffffffffffffff;
  }
LAB_0010202c:
  uVar8 = *(ulong *)((long)msp + 8);
  uVar18 = uVar8 - uVar25;
  if (uVar25 <= uVar8) {
    puVar12 = *(undefined8 **)((long)msp + 0x20);
    if (uVar18 < 0x20) {
      puVar12[1] = uVar8 | 3;
      pbVar2 = (byte *)((long)puVar12 + uVar8 + 8);
      *pbVar2 = *pbVar2 | 1;
      lVar28 = 0;
      uVar18 = 0;
    }
    else {
      lVar28 = (long)puVar12 + uVar25;
      *(ulong *)((long)puVar12 + uVar25 + 8) = uVar18 | 1;
      *(ulong *)((long)puVar12 + uVar8) = uVar18;
      puVar12[1] = uVar25 | 3;
    }
    *(long *)((long)msp + 0x20) = lVar28;
    *(ulong *)((long)msp + 8) = uVar18;
    goto LAB_00102133;
  }
  uVar8 = *(ulong *)((long)msp + 0x10) - uVar25;
  if (*(ulong *)((long)msp + 0x10) < uVar25 || uVar8 == 0) {
    if (mparams.magic == 0) {
      init_mparams();
    }
    if ((((*(byte *)((long)msp + 0x370) & 1) != 0) && (mparams.mmap_threshold <= uVar25)) &&
       (*(long *)((long)msp + 0x10) != 0)) {
      uVar8 = -mparams.page_size & mparams.page_size + uVar25 + 0x3e;
      if (*(ulong *)((long)msp + 0x368) == 0) {
        if (uVar25 < uVar8) goto LAB_0010214f;
      }
      else {
        uVar18 = *(ulong *)((long)msp + 0x358) + uVar8;
        if ((uVar25 < uVar8 && *(ulong *)((long)msp + 0x358) < uVar18) &&
            uVar18 <= *(ulong *)((long)msp + 0x368)) {
LAB_0010214f:
          pvVar11 = mmap((void *)0x0,uVar8,3,0x22,-1,0);
          if (pvVar11 != (void *)0xffffffffffffffff) {
            uVar25 = (ulong)(-(int)pvVar11 - 0x10U & 0xf);
            puVar12 = (undefined8 *)((long)pvVar11 + uVar25);
            *(ulong *)((long)pvVar11 + uVar25) = uVar25;
            *(ulong *)((long)pvVar11 + uVar25 + 8) = (uVar8 - uVar25) + -0x20;
            *(undefined8 *)((uVar8 - uVar25) + -0x18 + (long)puVar12) = 0xb;
            *(undefined8 *)((long)pvVar11 + (uVar8 - 0x10)) = 0;
            if ((*(void **)((long)msp + 0x18) == (void *)0x0) ||
               (pvVar11 < *(void **)((long)msp + 0x18))) {
              *(void **)((long)msp + 0x18) = pvVar11;
            }
            uVar8 = uVar8 + *(long *)((long)msp + 0x358);
            *(ulong *)((long)msp + 0x358) = uVar8;
            if (*(ulong *)((long)msp + 0x360) < uVar8) {
              *(ulong *)((long)msp + 0x360) = uVar8;
            }
            goto LAB_00102133;
          }
        }
      }
    }
    uVar8 = -mparams.granularity & mparams.granularity + 0x5f + uVar25;
    if (uVar8 <= uVar25) {
      return (void *)0x0;
    }
    if ((*(ulong *)((long)msp + 0x368) != 0) &&
       (uVar18 = *(ulong *)((long)msp + 0x358) + uVar8,
       *(ulong *)((long)msp + 0x368) < uVar18 || uVar18 <= *(ulong *)((long)msp + 0x358))) {
      return (void *)0x0;
    }
    pmVar13 = (mchunkptr)mmap((void *)0x0,uVar8,3,0x22,-1,0);
    if (pmVar13 == (mchunkptr)0xffffffffffffffff) goto LAB_0010274a;
    uVar18 = *(long *)((long)msp + 0x358) + uVar8;
    *(ulong *)((long)msp + 0x358) = uVar18;
    if (*(ulong *)((long)msp + 0x360) < uVar18) {
      *(ulong *)((long)msp + 0x360) = uVar18;
    }
    pmVar21 = *(malloc_chunk **)((long)msp + 0x28);
    if (pmVar21 == (malloc_chunk *)0x0) {
      if ((*(mchunkptr *)((long)msp + 0x18) == (mchunkptr)0x0) ||
         (pmVar13 < *(mchunkptr *)((long)msp + 0x18))) {
        *(mchunkptr *)((long)msp + 0x18) = pmVar13;
      }
      *(mchunkptr *)((long)msp + 0x378) = pmVar13;
      *(ulong *)((long)msp + 0x380) = uVar8;
      *(undefined4 *)((long)msp + 0x390) = 1;
      *(size_t *)((long)msp + 0x40) = mparams.magic;
      *(undefined8 *)((long)msp + 0x38) = 0xfff;
      init_bins((mstate)msp);
      pmVar21 = (malloc_chunk *)
                ((long)msp + ((*(ulong *)((long)msp + -8) & 0xfffffffffffffff8) - 0x10));
      sVar33 = (long)pmVar13 + (uVar8 - (long)pmVar21) + -0x50;
LAB_0010233b:
      init_top((mstate)msp,pmVar21,sVar33);
      goto LAB_0010273d;
    }
    plVar1 = (long *)((long)msp + 0x378);
    for (plVar14 = plVar1; plVar14 != (long *)0x0; plVar14 = (long *)plVar14[2]) {
      if (pmVar13 == (mchunkptr)((long)&((malloc_chunk *)*plVar14)->prev_foot + plVar14[1])) {
        if ((((pmVar21 < pmVar13) && ((malloc_chunk *)*plVar14 <= pmVar21)) &&
            ((*(uint *)(plVar14 + 3) & 8) == 0)) && ((*(uint *)(plVar14 + 3) & 1) != 0)) {
          plVar14[1] = plVar14[1] + uVar8;
          sVar33 = uVar8 + *(long *)((long)msp + 0x10);
          goto LAB_0010233b;
        }
        break;
      }
    }
    pmVar27 = *(mchunkptr *)((long)msp + 0x18);
    if (pmVar13 < *(mchunkptr *)((long)msp + 0x18)) {
      *(mchunkptr *)((long)msp + 0x18) = pmVar13;
      pmVar27 = pmVar13;
    }
    plVar14 = plVar1;
    while( true ) {
      if (plVar14 == (long *)0x0) goto LAB_00102452;
      lVar28 = *plVar14;
      if (lVar28 == (long)&pmVar13->prev_foot + uVar8) break;
      plVar14 = (long *)plVar14[2];
    }
    if (((~*(byte *)(plVar14 + 3) | *(byte *)(plVar14 + 3) >> 3) & 1) != 0) goto LAB_00102452;
    *plVar14 = (long)pmVar13;
    plVar14[1] = plVar14[1] + uVar8;
    uVar9 = (ulong)(-(int)pmVar13 - 0x10U & 0xf);
    puVar12 = (undefined8 *)((long)&pmVar13->prev_foot + uVar9);
    pmVar35 = (malloc_chunk *)((ulong)(-(int)lVar28 - 0x10U & 0xf) + lVar28);
    uVar8 = (long)puVar12 + uVar25;
    uVar18 = (long)pmVar35 - uVar8;
    *(ulong *)((long)&pmVar13->head + uVar9) = uVar25 | 3;
    if (pmVar35 == pmVar21) {
      uVar18 = uVar18 + *(long *)((long)msp + 0x10);
      *(ulong *)((long)msp + 0x10) = uVar18;
      *(ulong *)((long)msp + 0x28) = uVar8;
      *(ulong *)(uVar8 + 8) = uVar18 | 1;
      goto LAB_00102133;
    }
    if (pmVar35 == *(malloc_chunk **)((long)msp + 0x20)) {
      uVar18 = uVar18 + *(long *)((long)msp + 8);
      *(ulong *)((long)msp + 8) = uVar18;
      *(ulong *)((long)msp + 0x20) = uVar8;
      *(ulong *)(uVar8 + 8) = uVar18 | 1;
      *(ulong *)(uVar8 + uVar18) = uVar18;
      goto LAB_00102133;
    }
    uVar25 = pmVar35->head;
    pmVar21 = pmVar35;
    if (((uint)uVar25 & 3) != 1) goto LAB_001028c0;
    if (uVar25 < 0x100) {
      pmVar21 = pmVar35->fd;
      pmVar34 = pmVar35->bk;
      pmVar30 = (malloc_chunk *)((long)msp + (uVar25 >> 3) * 0x10 + 0x48);
      if ((pmVar21 != pmVar30) && ((pmVar21 < pmVar27 || (pmVar21->bk != pmVar35))))
      goto LAB_00102d78;
      if (pmVar34 == pmVar21) {
        bVar29 = (byte)(uVar25 >> 3) & 0x1f;
        *(uint *)msp = *msp & (-2 << bVar29 | 0xfffffffeU >> 0x20 - bVar29);
        goto LAB_001028ad;
      }
      if ((pmVar34 != pmVar30) && ((pmVar34 < pmVar27 || (pmVar34->fd != pmVar35))))
      goto LAB_00102d78;
      pmVar21->bk = pmVar34;
      pmVar34->fd = pmVar21;
      goto LAB_001028ad;
    }
    pmVar21 = pmVar35->bk;
    pmVar34 = pmVar35[1].fd;
    if (pmVar21 != pmVar35) {
      pmVar13 = pmVar35->fd;
      if (((pmVar13 < pmVar27) || (pmVar13->bk != pmVar35)) || (pmVar21->fd != pmVar35))
      goto LAB_00102d78;
      pmVar13->bk = pmVar21;
      pmVar21->fd = pmVar13;
      goto LAB_00102817;
    }
    if ((malloc_chunk *)pmVar35[1].head != (malloc_chunk *)0x0) {
      pmVar30 = (malloc_chunk *)pmVar35[1].head;
      pmVar13 = (mchunkptr)&pmVar35[1].head;
      goto LAB_001027e7;
    }
    if ((malloc_chunk *)pmVar35[1].prev_foot == (malloc_chunk *)0x0) {
      pmVar21 = (malloc_chunk *)0x0;
      goto LAB_00102817;
    }
    pmVar30 = (malloc_chunk *)pmVar35[1].prev_foot;
    pmVar13 = pmVar35 + 1;
LAB_001027e7:
    do {
      do {
        pmVar31 = pmVar13;
        pmVar21 = pmVar30;
        pmVar30 = (malloc_chunk *)pmVar21[1].head;
        pmVar13 = (mchunkptr)&pmVar21[1].head;
      } while ((malloc_chunk *)pmVar21[1].head != (malloc_chunk *)0x0);
      pmVar30 = (malloc_chunk *)pmVar21[1].prev_foot;
      pmVar13 = pmVar21 + 1;
    } while ((malloc_chunk *)pmVar21[1].prev_foot != (malloc_chunk *)0x0);
    if (pmVar31 < pmVar27) goto LAB_00102d78;
    pmVar31->prev_foot = 0;
LAB_00102817:
    if (pmVar34 != (malloc_chunk *)0x0) {
      uVar20 = *(uint *)&pmVar35[1].bk;
      if (pmVar35 == *(malloc_chunk **)((long)msp + (ulong)uVar20 * 8 + 600)) {
        *(malloc_chunk **)((long)msp + (ulong)uVar20 * 8 + 600) = pmVar21;
        if (pmVar21 == (malloc_chunk *)0x0) {
          bVar29 = (byte)uVar20 & 0x1f;
          *(uint *)((long)msp + 4) =
               *(uint *)((long)msp + 4) & (-2 << bVar29 | 0xfffffffeU >> 0x20 - bVar29);
        }
        else {
LAB_0010285a:
          pmVar30 = *(malloc_chunk **)((long)msp + 0x18);
          if (pmVar21 < pmVar30) goto LAB_00102d78;
          pmVar21[1].fd = pmVar34;
          pmVar34 = (malloc_chunk *)pmVar35[1].prev_foot;
          if (pmVar34 != (malloc_chunk *)0x0) {
            if (pmVar34 < pmVar30) goto LAB_00102d78;
            pmVar21[1].prev_foot = (size_t)pmVar34;
            pmVar34[1].fd = pmVar21;
          }
          uVar9 = pmVar35[1].head;
          if (uVar9 != 0) {
            if (uVar9 < *(ulong *)((long)msp + 0x18)) goto LAB_00102d78;
            pmVar21[1].head = uVar9;
            *(malloc_chunk **)(uVar9 + 0x30) = pmVar21;
          }
        }
      }
      else {
        if (pmVar34 < *(malloc_chunk **)((long)msp + 0x18)) goto LAB_00102d78;
        (&pmVar34[1].prev_foot)[(malloc_chunk *)pmVar34[1].prev_foot != pmVar35] = (size_t)pmVar21;
        if (pmVar21 != (malloc_chunk *)0x0) goto LAB_0010285a;
      }
    }
LAB_001028ad:
    uVar25 = uVar25 & 0xfffffffffffffff8;
    pmVar21 = (malloc_chunk *)((long)&pmVar35->prev_foot + uVar25);
    uVar18 = uVar18 + uVar25;
    uVar25 = *(ulong *)((long)&pmVar35->head + uVar25);
LAB_001028c0:
    pmVar21->head = uVar25 & 0xfffffffffffffffe;
    *(ulong *)(uVar8 + 8) = uVar18 | 1;
    *(ulong *)(uVar8 + uVar18) = uVar18;
    if (uVar18 < 0x100) {
      uVar18 = uVar18 >> 3;
      uVar25 = (long)msp + uVar18 * 0x10 + 0x48;
      if ((*msp >> ((uint)uVar18 & 0x1f) & 1) == 0) {
        *(uint *)msp = *msp | 1 << ((byte)uVar18 & 0x1f);
        uVar9 = uVar25;
      }
      else {
        uVar9 = *(ulong *)((long)msp + uVar18 * 0x10 + 0x58);
        if (uVar9 < *(ulong *)((long)msp + 0x18)) {
LAB_00102d78:
          abort();
        }
      }
      *(ulong *)((long)msp + uVar18 * 0x10 + 0x58) = uVar8;
      *(ulong *)(uVar9 + 0x18) = uVar8;
      *(ulong *)(uVar8 + 0x10) = uVar9;
      *(ulong *)(uVar8 + 0x18) = uVar25;
    }
    else {
      uVar20 = (uint)(uVar18 >> 8);
      if (uVar20 == 0) {
        uVar20 = 0;
      }
      else if (uVar20 < 0x10000) {
        uVar23 = 0x1f;
        if (uVar20 != 0) {
          for (; uVar20 >> uVar23 == 0; uVar23 = uVar23 - 1) {
          }
        }
        uVar20 = (uint)((uVar18 >> ((ulong)(byte)(0x26 - (char)(uVar23 ^ 0x1f)) & 0x3f) & 1) != 0) +
                 (uVar23 ^ 0x1f) * 2 ^ 0x3e;
      }
      else {
        uVar20 = 0x1f;
      }
      puVar26 = (ulong *)((long)msp + (ulong)uVar20 * 8 + 600);
      *(uint *)(uVar8 + 0x38) = uVar20;
      *(undefined1 (*) [16])(uVar8 + 0x20) = (undefined1  [16])0x0;
      if ((*(uint *)((long)msp + 4) >> (uVar20 & 0x1f) & 1) == 0) {
        *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar20 & 0x1f);
        *puVar26 = uVar8;
        *(ulong **)(uVar8 + 0x30) = puVar26;
      }
      else {
        bVar29 = 0x39 - (char)(uVar20 >> 1);
        if (uVar20 == 0x1f) {
          bVar29 = 0;
        }
        lVar28 = uVar18 << (bVar29 & 0x3f);
        uVar25 = *puVar26;
        do {
          uVar9 = uVar25;
          if ((*(ulong *)(uVar9 + 8) & 0xfffffffffffffff8) == uVar18) {
            if ((uVar9 < *(ulong *)((long)msp + 0x18)) ||
               (uVar25 = *(ulong *)(uVar9 + 0x10), uVar25 < *(ulong *)((long)msp + 0x18)))
            goto LAB_00102d78;
            *(ulong *)(uVar25 + 0x18) = uVar8;
            *(ulong *)(uVar9 + 0x10) = uVar8;
            *(ulong *)(uVar8 + 0x10) = uVar25;
            *(ulong *)(uVar8 + 0x18) = uVar9;
            *(undefined8 *)(uVar8 + 0x30) = 0;
            goto LAB_00102133;
          }
          lVar22 = lVar28 >> 0x3f;
          lVar28 = lVar28 * 2;
          uVar25 = *(ulong *)(uVar9 + 0x20 + lVar22 * -8);
        } while (uVar25 != 0);
        puVar26 = (ulong *)(uVar9 + 0x20 + lVar22 * -8);
        if (puVar26 < *(ulong **)((long)msp + 0x18)) goto LAB_00102d78;
        *puVar26 = uVar8;
        *(ulong *)(uVar8 + 0x30) = uVar9;
      }
      *(ulong *)(uVar8 + 0x18) = uVar8;
      *(ulong *)(uVar8 + 0x10) = uVar8;
    }
    goto LAB_00102133;
  }
  goto LAB_00102041;
code_r0x00102a8b:
  puVar19 = puVar19 + 5;
  goto LAB_00102a61;
LAB_00102452:
  pmVar15 = segment_holding((mstate)msp,(char *)pmVar21);
  pmVar30 = (malloc_chunk *)(pmVar15->base + pmVar15->size);
  pmVar34 = (malloc_chunk *)((long)pmVar30 + ((ulong)(0x4fU - (int)pmVar30 & 0xf) - 0x5f));
  pmVar35 = pmVar21 + 1;
  if (pmVar34 < pmVar35) {
    pmVar34 = pmVar21;
  }
  init_top((mstate)msp,pmVar13,uVar8 - 0x50);
  pmVar34->head = 0x33;
  pmVar4 = *(malloc_chunk **)((long)msp + 0x380);
  sVar33 = *(size_t *)((long)msp + 0x388);
  sVar5 = *(size_t *)((long)msp + 0x390);
  pmVar34->fd = (malloc_chunk *)*plVar1;
  pmVar34->bk = pmVar4;
  pmVar34[1].prev_foot = sVar33;
  pmVar34[1].head = sVar5;
  *(mchunkptr *)((long)msp + 0x378) = pmVar13;
  *(ulong *)((long)msp + 0x380) = uVar8;
  *(uint *)((long)msp + 0x390) = (uint)(pmVar13 != (mchunkptr)0xffffffffffffffff);
  *(malloc_chunk ***)((long)msp + 0x388) = &pmVar34->fd;
  auVar7 = _DAT_00105050;
  auVar6 = _DAT_00105040;
  if (pmVar30 <= pmVar34 + 2) {
    pmVar30 = pmVar34 + 2;
  }
  uVar18 = (long)pmVar30 + (-0x39 - (long)pmVar34);
  auVar39._8_4_ = (int)uVar18;
  auVar39._0_8_ = uVar18;
  auVar39._12_4_ = (int)(uVar18 >> 0x20);
  auVar37._0_8_ = uVar18 >> 3;
  auVar37._8_8_ = auVar39._8_8_ >> 3;
  uVar8 = 0;
  auVar37 = auVar37 ^ _DAT_00105050;
  do {
    auVar38._8_4_ = (int)uVar8;
    auVar38._0_8_ = uVar8;
    auVar38._12_4_ = (int)(uVar8 >> 0x20);
    auVar39 = (auVar38 | auVar6) ^ auVar7;
    if ((bool)(~(auVar39._4_4_ == auVar37._4_4_ && auVar37._0_4_ < auVar39._0_4_ ||
                auVar37._4_4_ < auVar39._4_4_) & 1)) {
      (&pmVar34[1].bk)[uVar8] = (malloc_chunk *)0xb;
    }
    if ((auVar39._12_4_ != auVar37._12_4_ || auVar39._8_4_ <= auVar37._8_4_) &&
        auVar39._12_4_ <= auVar37._12_4_) {
      (&pmVar34[2].prev_foot)[uVar8] = 0xb;
    }
    uVar8 = uVar8 + 2;
  } while (((uVar18 >> 3) + 2 & 0xfffffffffffffffe) != uVar8);
  uVar8 = (long)pmVar34 - (long)pmVar21;
  if (uVar8 != 0) {
    *(byte *)&pmVar34->head = (byte)pmVar34->head & 0xfe;
    pmVar21->head = uVar8 | 1;
    pmVar34->prev_foot = uVar8;
    if (uVar8 < 0x100) {
      uVar8 = uVar8 >> 3;
      pmVar35 = (malloc_chunk *)((long)msp + uVar8 * 0x10 + 0x48);
      if ((*msp >> ((uint)uVar8 & 0x1f) & 1) == 0) {
        *(uint *)msp = *msp | 1 << ((byte)uVar8 & 0x1f);
        pmVar34 = pmVar35;
      }
      else {
        pmVar34 = *(malloc_chunk **)((long)msp + uVar8 * 0x10 + 0x58);
        if (pmVar34 < *(malloc_chunk **)((long)msp + 0x18)) goto LAB_00102d78;
      }
      *(malloc_chunk **)((long)msp + uVar8 * 0x10 + 0x58) = pmVar21;
      pmVar34->bk = pmVar21;
      lVar28 = 0x18;
      lVar22 = 0x10;
    }
    else {
      uVar20 = (uint)(uVar8 >> 8);
      if (uVar20 == 0) {
        uVar20 = 0;
      }
      else if (uVar20 < 0x10000) {
        uVar23 = 0x1f;
        if (uVar20 != 0) {
          for (; uVar20 >> uVar23 == 0; uVar23 = uVar23 - 1) {
          }
        }
        uVar20 = (uint)((uVar8 >> ((ulong)(byte)(0x26 - (char)(uVar23 ^ 0x1f)) & 0x3f) & 1) != 0) +
                 (uVar23 ^ 0x1f) * 2 ^ 0x3e;
      }
      else {
        uVar20 = 0x1f;
      }
      pmVar34 = (malloc_chunk *)((long)msp + (ulong)uVar20 * 8 + 600);
      *(uint *)&pmVar21[1].bk = uVar20;
      pmVar35->prev_foot = 0;
      pmVar35->head = 0;
      if ((*(uint *)((long)msp + 4) >> (uVar20 & 0x1f) & 1) == 0) {
        *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar20 & 0x1f);
        pmVar34->prev_foot = (size_t)pmVar21;
        pmVar21[1].fd = pmVar34;
      }
      else {
        bVar29 = 0x39 - (char)(uVar20 >> 1);
        if (uVar20 == 0x1f) {
          bVar29 = 0;
        }
        lVar28 = uVar8 << (bVar29 & 0x3f);
        pmVar35 = (malloc_chunk *)pmVar34->prev_foot;
        do {
          pmVar34 = pmVar35;
          if ((pmVar34->head & 0xfffffffffffffff8) == uVar8) {
            if ((pmVar34 < *(malloc_chunk **)((long)msp + 0x18)) ||
               (pmVar35 = pmVar34->fd, pmVar35 < *(malloc_chunk **)((long)msp + 0x18)))
            goto LAB_00102d78;
            pmVar35->bk = pmVar21;
            pmVar34->fd = pmVar21;
            pmVar21->fd = pmVar35;
            lVar28 = 0x30;
            lVar22 = 0x18;
            pmVar35 = (malloc_chunk *)0x0;
            goto LAB_00102735;
          }
          lVar22 = lVar28 >> 0x3f;
          lVar28 = lVar28 * 2;
          pmVar35 = *(malloc_chunk **)((long)pmVar34 + lVar22 * -8 + 0x20);
        } while (pmVar35 != (malloc_chunk *)0x0);
        puVar19 = (undefined8 *)((long)pmVar34 + lVar22 * -8 + 0x20);
        if (puVar19 < *(undefined8 **)((long)msp + 0x18)) goto LAB_00102d78;
        *puVar19 = pmVar21;
        pmVar21[1].fd = pmVar34;
      }
      lVar28 = 0x10;
      lVar22 = 0x18;
      pmVar34 = pmVar21;
      pmVar35 = pmVar21;
    }
LAB_00102735:
    *(malloc_chunk **)((long)&pmVar21->prev_foot + lVar22) = pmVar34;
    *(malloc_chunk **)((long)&pmVar21->prev_foot + lVar28) = pmVar35;
  }
LAB_0010273d:
  uVar8 = *(ulong *)((long)msp + 0x10) - uVar25;
  if (*(ulong *)((long)msp + 0x10) < uVar25 || uVar8 == 0) {
LAB_0010274a:
    piVar16 = __errno_location();
    *piVar16 = 0xc;
    return (void *)0x0;
  }
LAB_00102041:
  *(ulong *)((long)msp + 0x10) = uVar8;
  puVar12 = *(undefined8 **)((long)msp + 0x28);
  *(ulong *)((long)msp + 0x28) = (long)puVar12 + uVar25;
  *(ulong *)((long)puVar12 + uVar25 + 8) = uVar8 | 1;
  puVar12[1] = uVar25 | 3;
LAB_00102133:
  return puVar12 + 2;
}

Assistant:

void* mspace_malloc(mspace msp, size_t bytes) {
  mstate ms = (mstate)msp;
  if (!ok_magic(ms)) {
    USAGE_ERROR_ACTION(ms,ms);
    return 0;
  }
  if (!PREACTION(ms)) {
    void* mem;
    size_t nb;
    if (bytes <= MAX_SMALL_REQUEST) {
      bindex_t idx;
      binmap_t smallbits;
      nb = (bytes < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(bytes);
      idx = small_index(nb);
      smallbits = ms->smallmap >> idx;

      if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
        mchunkptr b, p;
        idx += ~smallbits & 1;       /* Uses next bin if idx empty */
        b = smallbin_at(ms, idx);
        p = b->fd;
        assert(chunksize(p) == small_index2size(idx));
        unlink_first_small_chunk(ms, b, p, idx);
        set_inuse_and_pinuse(ms, p, small_index2size(idx));
        mem = chunk2mem(p);
        check_malloced_chunk(ms, mem, nb);
        goto postaction;
      }

      else if (nb > ms->dvsize) {
        if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
          mchunkptr b, p, r;
          size_t rsize;
          bindex_t i;
          binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
          binmap_t leastbit = least_bit(leftbits);
          compute_bit2idx(leastbit, i);
          b = smallbin_at(ms, i);
          p = b->fd;
          assert(chunksize(p) == small_index2size(i));
          unlink_first_small_chunk(ms, b, p, i);
          rsize = small_index2size(i) - nb;
          /* Fit here cannot be remainderless if 4byte sizes */
          if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE)
            set_inuse_and_pinuse(ms, p, small_index2size(i));
          else {
            set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
            r = chunk_plus_offset(p, nb);
            set_size_and_pinuse_of_free_chunk(r, rsize);
            replace_dv(ms, r, rsize);
          }
          mem = chunk2mem(p);
          check_malloced_chunk(ms, mem, nb);
          goto postaction;
        }

        else if (ms->treemap != 0 && (mem = tmalloc_small(ms, nb)) != 0) {
          check_malloced_chunk(ms, mem, nb);
          goto postaction;
        }
      }
    }
    else if (bytes >= MAX_REQUEST)
      nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
    else {
      nb = pad_request(bytes);
      if (ms->treemap != 0 && (mem = tmalloc_large(ms, nb)) != 0) {
        check_malloced_chunk(ms, mem, nb);
        goto postaction;
      }
    }

    if (nb <= ms->dvsize) {
      size_t rsize = ms->dvsize - nb;
      mchunkptr p = ms->dv;
      if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
        mchunkptr r = ms->dv = chunk_plus_offset(p, nb);
        ms->dvsize = rsize;
        set_size_and_pinuse_of_free_chunk(r, rsize);
        set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
      }
      else { /* exhaust dv */
        size_t dvs = ms->dvsize;
        ms->dvsize = 0;
        ms->dv = 0;
        set_inuse_and_pinuse(ms, p, dvs);
      }
      mem = chunk2mem(p);
      check_malloced_chunk(ms, mem, nb);
      goto postaction;
    }

    else if (nb < ms->topsize) { /* Split top */
      size_t rsize = ms->topsize -= nb;
      mchunkptr p = ms->top;
      mchunkptr r = ms->top = chunk_plus_offset(p, nb);
      r->head = rsize | PINUSE_BIT;
      set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
      mem = chunk2mem(p);
      check_top_chunk(ms, ms->top);
      check_malloced_chunk(ms, mem, nb);
      goto postaction;
    }

    mem = sys_alloc(ms, nb);

  postaction:
    POSTACTION(ms);
    return mem;
  }

  return 0;
}